

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O2

edata_t * duckdb_je_eset_fit(eset_t *eset,size_t esize,size_t alignment,_Bool exact_only,
                            uint lg_max_fit)

{
  long lVar1;
  _Bool _Var2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  edata_t *peVar6;
  byte bVar7;
  uint uVar8;
  size_t extraout_RDX;
  ulong uVar9;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uintptr_t uVar13;
  ulong uVar14;
  edata_cmp_summary_t a;
  edata_cmp_summary_t b;
  uint64_t local_40;
  size_t extraout_RDX_00;
  
  uVar3 = alignment + 0xfff & 0xfffffffffffff000;
  uVar14 = (esize - 0x1000) + uVar3;
  if (esize <= uVar14) {
    sVar4 = duckdb_je_sz_psz_quantize_ceil(uVar14);
    if (sVar4 < 0x7000000000000001) {
      uVar9 = sVar4 - 1;
      if (uVar9 == 0) {
        uVar8 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar8 = (uint)lVar1 ^ 0x3f;
      }
      iVar12 = 0x32 - uVar8;
      if (0x32 < uVar8) {
        iVar12 = 0;
      }
      bVar7 = (char)iVar12 + 0xb;
      if (sVar4 < 0x4001) {
        bVar7 = 0xc;
      }
      uVar8 = (uint)(uVar9 >> (bVar7 & 0x3f)) & 3;
      sVar4 = (size_t)uVar8;
      sVar5 = (size_t)(uVar8 + iVar12 * 4);
    }
    else {
      sVar5 = 199;
      sVar4 = extraout_RDX;
    }
    if (exact_only) {
      _Var2 = duckdb_je_edata_heap_empty(&eset->bins[sVar5].heap);
      if (_Var2) {
        peVar6 = (edata_t *)0x0;
      }
      else {
        peVar6 = duckdb_je_edata_heap_first(&eset->bins[sVar5].heap);
      }
    }
    else {
      uVar9 = fb_ffs(eset->bitmap,sVar5,sVar4);
      peVar6 = (edata_t *)0x0;
      local_40 = 0;
      uVar13 = 0;
      while (uVar10 = uVar9 & 0xffffffff, uVar10 < 200) {
        if (lg_max_fit == 0x40) {
          lg_max_fit = 0x3f;
        }
        if (uVar14 < duckdb_je_sz_pind2sz_tab[uVar10] >> ((byte)lg_max_fit & 0x3f)) break;
        if ((peVar6 == (edata_t *)0x0) ||
           (a.addr = eset->bins[uVar10].heap_min.addr, a.sn = eset->bins[uVar10].heap_min.sn,
           b.addr = uVar13, b.sn = local_40, iVar12 = edata_cmp_summary_comp(a,b),
           sVar4 = extraout_RDX_00, iVar12 < 0)) {
          peVar6 = duckdb_je_edata_heap_first(&eset->bins[uVar10].heap);
          local_40 = eset->bins[uVar10].heap_min.sn;
          uVar13 = eset->bins[uVar10].heap_min.addr;
          sVar4 = extraout_RDX_01;
        }
        if ((int)uVar9 == 199) break;
        uVar9 = fb_ffs(eset->bitmap,uVar10 + 1,sVar4);
      }
    }
    if (alignment < 0x1001) {
      return peVar6;
    }
    if (peVar6 != (edata_t *)0x0) {
      return peVar6;
    }
    sVar4 = duckdb_je_sz_psz_quantize_ceil(esize);
    if (sVar4 < 0x7000000000000001) {
      uVar9 = sVar4 - 1;
      if (uVar9 == 0) {
        uVar8 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar8 = (uint)lVar1 ^ 0x3f;
      }
      iVar12 = 0x32 - uVar8;
      if (0x32 < uVar8) {
        iVar12 = 0;
      }
      bVar7 = (char)iVar12 + 0xb;
      if (sVar4 < 0x4001) {
        bVar7 = 0xc;
      }
      sVar4 = (size_t)(((uint)(uVar9 >> (bVar7 & 0x3f)) & 3) + iVar12 * 4);
    }
    else {
      sVar4 = 199;
    }
    sVar5 = duckdb_je_sz_psz_quantize_ceil(uVar14);
    if (sVar5 < 0x7000000000000001) {
      uVar14 = sVar5 - 1;
      if (uVar14 == 0) {
        uVar8 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar8 = (uint)lVar1 ^ 0x3f;
      }
      iVar12 = 0x32 - uVar8;
      if (0x32 < uVar8) {
        iVar12 = 0;
      }
      bVar7 = (char)iVar12 + 0xb;
      if (sVar5 < 0x4001) {
        bVar7 = 0xc;
      }
      uVar8 = (uint)(uVar14 >> (bVar7 & 0x3f)) & 3;
      sVar5 = (size_t)uVar8;
      uVar8 = uVar8 + iVar12 * 4;
    }
    else {
      uVar8 = 199;
      sVar5 = extraout_RDX_02;
    }
    uVar14 = fb_ffs(eset->bitmap,sVar4,sVar5);
    for (; (uint)uVar14 < uVar8; uVar14 = fb_ffs(eset->bitmap,(uVar14 & 0xffffffff) + 1,uVar10)) {
      peVar6 = duckdb_je_edata_heap_first(&eset->bins[uVar14 & 0xffffffff].heap);
      uVar10 = (ulong)peVar6->e_addr & 0xfffffffffffff000;
      uVar9 = (uVar3 - 1) + uVar10 & -uVar3;
      if (((uVar10 <= uVar9) &&
          (uVar11 = ((peVar6->field_2).e_size_esn & 0xfffffffffffff000) + uVar10, uVar9 < uVar11))
         && (esize <= uVar11 - uVar9)) {
        return peVar6;
      }
    }
  }
  return (edata_t *)0x0;
}

Assistant:

edata_t *
eset_fit(eset_t *eset, size_t esize, size_t alignment, bool exact_only,
    unsigned lg_max_fit) {
	size_t max_size = esize + PAGE_CEILING(alignment) - PAGE;
	/* Beware size_t wrap-around. */
	if (max_size < esize) {
		return NULL;
	}

	edata_t *edata = eset_first_fit(eset, max_size, exact_only, lg_max_fit);

	if (alignment > PAGE && edata == NULL) {
		/*
		 * max_size guarantees the alignment requirement but is rather
		 * pessimistic.  Next we try to satisfy the aligned allocation
		 * with sizes in [esize, max_size).
		 */
		edata = eset_fit_alignment(eset, esize, max_size, alignment);
	}

	return edata;
}